

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

bool __thiscall QAbstractItemView::event(QAbstractItemView *this,QEvent *event)

{
  ushort uVar1;
  QAbstractItemViewPrivate *this_00;
  bool bVar2;
  QWidget *this_01;
  long in_FS_OFFSET;
  QModelIndex local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractItemViewPrivate **)(this + 8);
  uVar1 = *(ushort *)(event + 8);
  if (uVar1 < 0x58) {
    if (uVar1 < 0x11) {
      if (uVar1 == 9) {
        QAbstractItemViewPrivate::checkPersistentEditorFocus(this_00);
      }
      else if (((uVar1 == 0xc) && (this_00->delayedPendingLayout == true)) &&
              (this_00->state != CollapsingState)) {
        QBasicTimer::stop();
        this_00->delayedPendingLayout = false;
        (**(code **)(**(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      goto LAB_00531dfa;
    }
    if (uVar1 == 0x11) {
      if ((this_00->delayedPendingLayout == true) && (this_00->state != CollapsingState)) {
        QBasicTimer::stop();
        this_00->delayedPendingLayout = false;
        (**(code **)(**(long **)&(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                                 super_QWidgetPrivate.field_0x8 + 0x220))();
      }
      if (this_00->shouldScrollToCurrentOnShow == true) {
        this_00->shouldScrollToCurrentOnShow = false;
        local_48.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
        local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_48.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
        currentIndex(&local_48,this);
        if (((-1 < local_48.r) && (-1 < (long)local_48._0_8_)) &&
           ((local_48.m.ptr != (QAbstractItemModel *)0x0 &&
            ((this_00->state == EditingState || (this_00->autoScroll == true)))))) {
          (**(code **)(*(long *)this + 0x1e8))(this,&local_48,0);
        }
      }
      goto LAB_00531dfa;
    }
    if (uVar1 != 0x25) goto LAB_00531dfa;
  }
  else {
    if (0x60 < uVar1) {
      if (uVar1 == 0x61) {
        if (this_00->delayedPendingLayout == false) {
          this_00->delayedPendingLayout = true;
          QBasicTimer::start(&this_00->delayedLayout,0,1,
                             *(undefined8 *)
                              &(this_00->super_QAbstractScrollAreaPrivate).super_QFramePrivate.
                               super_QWidgetPrivate.field_0x8);
        }
      }
      else if (uVar1 == 100) {
        (**(code **)(*(long *)this + 0x220))(this);
        if (this_00->verticalScrollModeSet == false) {
          resetVerticalScrollMode(this);
        }
        if (this_00->horizontalScrollModeSet == false) {
          resetHorizontalScrollMode(this);
        }
      }
      goto LAB_00531dfa;
    }
    if (uVar1 == 0x58) {
      this_01 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
      QWidget::update(this_01);
      goto LAB_00531dfa;
    }
    if (uVar1 != 0x5a) goto LAB_00531dfa;
  }
  (**(code **)(*(long *)this + 0x268))(this);
LAB_00531dfa:
  bVar2 = QAbstractScrollArea::event((QAbstractScrollArea *)this,event);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool QAbstractItemView::event(QEvent *event)
{
    Q_D(QAbstractItemView);
    switch (event->type()) {
    case QEvent::Paint:
        //we call this here because the scrollbars' visibility might be altered
        //so this can't be done in the paintEvent method
        d->executePostedLayout(); //make sure we set the layout properly
        break;
    case QEvent::Show:
        d->executePostedLayout(); //make sure we set the layout properly
        if (d->shouldScrollToCurrentOnShow) {
            d->shouldScrollToCurrentOnShow = false;
            const QModelIndex current = currentIndex();
            if (current.isValid() && (d->state == QAbstractItemView::EditingState || d->autoScroll))
                scrollTo(current);
        }
        break;
    case QEvent::LocaleChange:
        viewport()->update();
        break;
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
        updateGeometries();
        break;
    case QEvent::StyleChange:
        doItemsLayout();
        if (!d->verticalScrollModeSet)
            resetVerticalScrollMode();
        if (!d->horizontalScrollModeSet)
            resetHorizontalScrollMode();
        break;
    case QEvent::FocusOut:
        d->checkPersistentEditorFocus();
        break;
    case QEvent::FontChange:
        d->doDelayedItemsLayout(); // the size of the items will change
        break;
    default:
        break;
    }
    return QAbstractScrollArea::event(event);
}